

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_array_iter_init(BigArrayIter *iter,BigArray *array)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char ndtype [8];
  char acStack_18 [2];
  char local_16 [6];
  
  memset(iter,0,0x118);
  iter->array = array;
  memset(iter,0,0x100);
  iter->dataptr = array->data;
  _dtype_normalize(acStack_18,array->dtype);
  iVar1 = atoi(local_16);
  iter->contiguous = 1;
  if (0 < (long)array->ndim) {
    lVar2 = (long)iVar1;
    lVar3 = (long)array->ndim + 1;
    do {
      if (array->strides[lVar3 + -2] != lVar2) {
        iter->contiguous = 0;
        return 0;
      }
      lVar2 = lVar2 * *(long *)(array->dtype + lVar3 * 8 + -4);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return 0;
}

Assistant:

int
big_array_iter_init(BigArrayIter * iter, BigArray * array)
{
    memset(iter, 0, sizeof(iter[0]));

    iter->array = array;

    memset(iter->pos, 0, sizeof(ptrdiff_t) * 32);
    iter->dataptr = array->data;

    /* see if the iter is contiguous */
    size_t elsize = big_file_dtype_itemsize(array->dtype);

    int i = 0; 
    ptrdiff_t stride_contiguous = elsize;
    iter->contiguous = 1;
    for(i = array->ndim - 1; i >= 0; i --) {
        if(array->strides[i] != stride_contiguous) {
            iter->contiguous = 0;
            break;
        }
        stride_contiguous *= array->dims[i];
    }
    return 0;
}